

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O0

void __thiscall glu::ObjectVector::~ObjectVector(ObjectVector *this)

{
  ObjectVector *this_local;
  
  clear(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_objects);
  return;
}

Assistant:

ObjectVector::~ObjectVector (void)
{
	clear();
}